

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O0

void fnode_service_notify_state(fnode_service_t *svc,char *state,uint32_t size)

{
  _Bool _Var1;
  uint in_EDX;
  char *in_RSI;
  long in_RDI;
  fcmd_node_status cmd;
  size_t time_now;
  undefined4 in_stack_fffffffffffffbb8;
  undefined1 *__dest;
  fnet_socket_t in_stack_fffffffffffffbd0;
  undefined1 local_42c;
  undefined1 local_42b;
  undefined1 local_42a;
  undefined1 local_429;
  undefined8 local_428;
  undefined1 auStack_420 [1024];
  size_t local_20;
  uint local_14;
  char *local_10;
  long local_8;
  
  if (in_RDI != 0) {
    local_14 = in_EDX;
    local_10 = in_RSI;
    local_8 = in_RDI;
    local_20 = fnode_service_time();
    memset(&local_42c,0,0x40c);
    local_42c = 0x44;
    local_42b = 0x41;
    local_42a = 0x54;
    local_429 = 0x41;
    local_428 = *(undefined8 *)(local_8 + 4);
    __dest = auStack_420;
    if (0x400 < local_14) {
      local_14 = 0x400;
    }
    memcpy(__dest,local_10,(ulong)local_14);
    _Var1 = fnet_socket_sendto(in_stack_fffffffffffffbd0,local_10,(size_t)__dest,
                               (fnet_address_t *)CONCAT44(local_14,in_stack_fffffffffffffbb8));
    if (_Var1) {
      *(size_t *)(local_8 + 0x4b8) = local_20;
    }
  }
  return;
}

Assistant:

void fnode_service_notify_state(fnode_service_t *svc, char const state[FMAX_DATA_LENGTH], uint32_t size)
{
    if (svc)
    {
        size_t time_now = fnode_service_time();

        fcmd_node_status cmd = {{ FCMD_CHARS(FCMD_DATA) }};
        memcpy(cmd.sn,       svc->sn,       sizeof svc->sn);
        memcpy(cmd.data,     state,         size > FMAX_DATA_LENGTH ? FMAX_DATA_LENGTH : size);

        if (fnet_socket_sendto(svc->socket, (const char *)&cmd, sizeof cmd, &svc->server))
            svc->last_cmd_time = time_now;
    }
}